

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktShaderRenderTextureFunctionTests.cpp
# Opt level: O1

float vkt::sr::anon_unknown_0::TextureTestUtil::computeLodFromDerivates
                (LodMode mode,float dudx,float dvdx,float dwdx,float dudy,float dvdy,float dwdy)

{
  uint uVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  
  if (mode == LODMODE_EXACT) {
    fVar2 = dwdx * dwdx + dudx * dudx + dvdx * dvdx;
    if (fVar2 < 0.0) {
      fVar2 = sqrtf(fVar2);
    }
    else {
      fVar2 = SQRT(fVar2);
    }
    fVar4 = dwdy * dwdy + dudy * dudy + dvdy * dvdy;
    if (fVar4 < 0.0) {
      fVar4 = sqrtf(fVar4);
    }
    else {
      fVar4 = SQRT(fVar4);
    }
    fVar2 = (float)(~-(uint)(fVar4 <= fVar2) & (uint)fVar4 | (uint)fVar2 & -(uint)(fVar4 <= fVar2));
  }
  else {
    uVar1 = -(uint)(-dudx <= dudx);
    fVar2 = (float)(uVar1 & (uint)dudx | ~uVar1 & (uint)-dudx);
    uVar1 = -(uint)(-dudy <= dudy);
    fVar4 = (float)(uVar1 & (uint)dudy | ~uVar1 & (uint)-dudy);
    uVar1 = -(uint)(fVar4 <= fVar2);
    fVar4 = (float)(~uVar1 & (uint)fVar4 | uVar1 & (uint)fVar2);
    uVar1 = -(uint)(-dvdx <= dvdx);
    fVar2 = (float)(uVar1 & (uint)dvdx | ~uVar1 & (uint)-dvdx);
    uVar1 = -(uint)(-dvdy <= dvdy);
    fVar5 = (float)(uVar1 & (uint)dvdy | ~uVar1 & (uint)-dvdy);
    uVar1 = -(uint)(fVar5 <= fVar2);
    fVar5 = (float)(~uVar1 & (uint)fVar5 | uVar1 & (uint)fVar2);
    uVar1 = -(uint)(-dwdx <= dwdx);
    fVar3 = (float)(uVar1 & (uint)dwdx | ~uVar1 & (uint)-dwdx);
    uVar1 = -(uint)(-dwdy <= dwdy);
    fVar2 = (float)(uVar1 & (uint)dwdy | ~uVar1 & (uint)-dwdy);
    uVar1 = -(uint)(fVar2 <= fVar3);
    fVar2 = (float)(~uVar1 & (uint)fVar2 | uVar1 & (uint)fVar3);
    if (mode == LODMODE_MIN_BOUND) {
      fVar4 = (float)(~-(uint)(fVar5 <= fVar4) & (uint)fVar5 | -(uint)(fVar5 <= fVar4) & (uint)fVar4
                     );
      uVar1 = -(uint)(fVar2 <= fVar4);
      fVar2 = (float)(~uVar1 & (uint)fVar2 | uVar1 & (uint)fVar4);
    }
    else {
      fVar2 = fVar4 + fVar5 + fVar2;
    }
  }
  fVar2 = logf(fVar2);
  return fVar2 * 1.442695;
}

Assistant:

float computeLodFromDerivates (LodMode mode, float dudx, float dvdx, float dwdx, float dudy, float dvdy, float dwdy)
{
	float p = 0.0f;
	switch (mode)
	{
		case LODMODE_EXACT:
			p = de::max(deFloatSqrt(dudx*dudx + dvdx*dvdx + dwdx*dwdx), deFloatSqrt(dudy*dudy + dvdy*dvdy + dwdy*dwdy));
			break;

		case LODMODE_MIN_BOUND:
		case LODMODE_MAX_BOUND:
		{
			float mu = de::max(deFloatAbs(dudx), deFloatAbs(dudy));
			float mv = de::max(deFloatAbs(dvdx), deFloatAbs(dvdy));
			float mw = de::max(deFloatAbs(dwdx), deFloatAbs(dwdy));

			p = mode == LODMODE_MIN_BOUND ? de::max(de::max(mu, mv), mw) : (mu + mv + mw);
			break;
		}

		default:
			DE_ASSERT(DE_FALSE);
	}

	return deFloatLog2(p);
}